

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O3

Interval1f __thiscall
embree::motion_derivative_regression_test::run::EvalFunc::operator()(EvalFunc *this,Interval1f *t)

{
  undefined8 *in_RDX;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar8;
  double dVar6;
  float fVar9;
  Interval1f IVar7;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_68;
  
  fVar19 = (float)*in_RDX;
  fVar14 = (float)((ulong)*in_RDX >> 0x20);
  fVar1 = fVar19 * 5.438017;
  fVar8 = fVar14 * 5.438017;
  local_68 = fVar8;
  if (fVar8 <= fVar1) {
    local_68 = fVar1;
    fVar1 = fVar8;
  }
  fVar8 = -1.0;
  fVar20 = 1.0;
  if (local_68 - fVar1 < 3.1415927) {
    if (6.283185307179586 < (double)local_68) {
      dVar6 = floor((double)local_68 / 6.283185307179586);
      fVar1 = fVar1 + (float)(dVar6 * -6.283185307179586);
      local_68 = local_68 + (float)(dVar6 * -6.283185307179586);
    }
    if (fVar1 < 0.0) {
      dVar6 = floor((double)fVar1 / 6.283185307179586);
      fVar1 = fVar1 + (float)(dVar6 * -6.283185307179586);
      local_68 = local_68 + (float)(dVar6 * -6.283185307179586);
    }
    fVar2 = cosf(fVar1);
    fVar8 = cosf(local_68);
    fVar20 = fVar2;
    if (fVar2 <= fVar8) {
      fVar20 = fVar8;
      fVar8 = fVar2;
    }
    if ((fVar1 < 3.1415927) && (3.1415927 < local_68)) {
      fVar8 = -1.0;
    }
  }
  fVar13 = 1.0;
  fVar2 = (float)*in_RDX;
  fVar18 = (float)((ulong)*in_RDX >> 0x20);
  fVar1 = fVar2 * 5.438017;
  fVar9 = fVar18 * 5.438017;
  local_68 = fVar9;
  if (fVar9 <= fVar1) {
    local_68 = fVar1;
    fVar1 = fVar9;
  }
  fVar9 = -1.0;
  if (local_68 - fVar1 < 3.1415927) {
    if (6.283185307179586 < (double)local_68) {
      dVar6 = floor((double)local_68 / 6.283185307179586);
      fVar1 = fVar1 + (float)(dVar6 * -6.283185307179586);
      local_68 = local_68 + (float)(dVar6 * -6.283185307179586);
    }
    if (fVar1 < 0.0) {
      dVar6 = floor((double)fVar1 / 6.283185307179586);
      fVar1 = fVar1 + (float)(dVar6 * -6.283185307179586);
      local_68 = local_68 + (float)(dVar6 * -6.283185307179586);
    }
    fVar3 = sinf(fVar1);
    fVar4 = sinf(local_68);
    fVar9 = fVar3;
    if (fVar3 <= fVar4) {
      fVar9 = fVar4;
    }
    fVar13 = fVar9;
    if (1.5707964 < local_68) {
      fVar13 = 1.0;
    }
    if (1.5707964 <= fVar1) {
      fVar13 = fVar9;
    }
    if (fVar3 <= fVar4) {
      fVar4 = fVar3;
    }
    if ((4.712389 <= fVar1) || (fVar9 = -1.0, local_68 <= 4.712389)) {
      fVar9 = fVar4;
    }
  }
  fVar1 = fVar2 * 786.18195;
  fVar3 = fVar18 * 786.18195;
  fVar4 = fVar3;
  if (fVar3 <= fVar1) {
    fVar4 = fVar1;
  }
  fVar10 = fVar2 * -559.99316;
  fVar11 = fVar18 * -559.99316;
  fVar15 = fVar10;
  if (fVar11 <= fVar10) {
    fVar15 = fVar11;
  }
  fVar5 = fVar2 * fVar15;
  fVar15 = fVar15 * fVar18;
  fVar16 = fVar15;
  if (fVar15 <= fVar5) {
    fVar16 = fVar5;
  }
  if (fVar11 <= fVar10) {
    fVar11 = fVar10;
  }
  fVar2 = fVar2 * fVar11;
  fVar11 = fVar11 * fVar18;
  fVar10 = fVar11;
  if (fVar11 <= fVar2) {
    fVar10 = fVar2;
  }
  if (fVar10 <= fVar16) {
    fVar10 = fVar16;
  }
  fVar10 = fVar10 + fVar4 + -320.57147;
  if (fVar3 <= fVar1) {
    fVar1 = fVar3;
  }
  if (fVar15 <= fVar5) {
    fVar5 = fVar15;
  }
  if (fVar11 <= fVar2) {
    fVar2 = fVar11;
  }
  if (fVar2 <= fVar5) {
    fVar5 = fVar2;
  }
  fVar5 = fVar5 + fVar1 + -320.57147;
  fVar1 = fVar19 * -116.007454;
  fVar3 = fVar14 * -116.007454;
  fVar11 = fVar19 * 411.19305;
  fVar4 = fVar14 * 411.19305;
  fVar2 = fVar11;
  if (fVar4 <= fVar11) {
    fVar2 = fVar4;
  }
  fVar12 = fVar19 * -160.02002;
  fVar15 = fVar14 * -160.02002;
  fVar16 = fVar12;
  if (fVar15 <= fVar12) {
    fVar16 = fVar15;
  }
  fVar17 = fVar19 * fVar16;
  fVar16 = fVar16 * fVar14;
  if (fVar15 <= fVar12) {
    fVar15 = fVar12;
  }
  fVar12 = fVar17;
  if (fVar16 <= fVar17) {
    fVar12 = fVar16;
  }
  fVar19 = fVar19 * fVar15;
  fVar15 = fVar15 * fVar14;
  fVar14 = fVar19;
  if (fVar15 <= fVar19) {
    fVar14 = fVar15;
  }
  if (fVar14 <= fVar12) {
    fVar12 = fVar14;
  }
  fVar12 = fVar12 + fVar2 + -198.23581;
  if (fVar4 <= fVar11) {
    fVar4 = fVar11;
  }
  if (fVar16 <= fVar17) {
    fVar16 = fVar17;
  }
  if (fVar15 <= fVar19) {
    fVar15 = fVar19;
  }
  fVar19 = fVar3;
  if (fVar3 <= fVar1) {
    fVar19 = fVar1;
  }
  if (fVar15 <= fVar16) {
    fVar15 = fVar16;
  }
  fVar14 = fVar12 * fVar8;
  fVar12 = fVar12 * fVar20;
  fVar15 = fVar15 + fVar4 + -198.23581;
  fVar2 = fVar12;
  if (fVar12 <= fVar14) {
    fVar2 = fVar14;
  }
  fVar8 = fVar8 * fVar15;
  fVar15 = fVar15 * fVar20;
  fVar20 = fVar15;
  if (fVar15 <= fVar8) {
    fVar20 = fVar8;
  }
  if (fVar20 <= fVar2) {
    fVar20 = fVar2;
  }
  if (fVar3 <= fVar1) {
    fVar1 = fVar3;
  }
  if (fVar12 <= fVar14) {
    fVar14 = fVar12;
  }
  if (fVar15 <= fVar8) {
    fVar8 = fVar15;
  }
  if (fVar8 <= fVar14) {
    fVar14 = fVar8;
  }
  fVar2 = fVar5 * fVar9;
  fVar5 = fVar5 * fVar13;
  fVar9 = fVar9 * fVar10;
  fVar10 = fVar10 * fVar13;
  fVar8 = fVar2;
  if (fVar5 <= fVar2) {
    fVar8 = fVar5;
  }
  fVar13 = fVar9;
  if (fVar10 <= fVar9) {
    fVar13 = fVar10;
  }
  if (fVar13 <= fVar8) {
    fVar8 = fVar13;
  }
  if (fVar5 <= fVar2) {
    fVar5 = fVar2;
  }
  IVar7.upper = fVar18;
  IVar7.lower = fVar5;
  if (fVar10 <= fVar9) {
    fVar10 = fVar9;
  }
  if (fVar10 <= fVar5) {
    fVar10 = fVar5;
  }
  *(float *)this = fVar8 + fVar14 + fVar1 + 62.787994;
  *(float *)(this + 4) = fVar10 + fVar20 + fVar19 + 62.787994;
  return IVar7;
}

Assistant:

Interval1f operator()(Interval1f const& t) const {
          return (t - 1.0f) * (t + 1.0f) * (t + 0.99999f);
        }